

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_logger.cpp
# Opt level: O1

void __thiscall LoaderLogger::LoaderLogger(LoaderLogger *this)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  _Head_base<0UL,_LoaderLogRecorder_*,_false> local_50;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  (this->_recorders).
  super__Vector_base<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_recorders).
  super__Vector_base<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)((long)&(this->_mutex).super___shared_timed_mutex_base._M_rwlock + 0x30) = 0;
  (this->_recorders).
  super__Vector_base<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)((long)&(this->_mutex).super___shared_timed_mutex_base._M_rwlock + 0x20) = 0;
  (this->_mutex).super___shared_timed_mutex_base._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->_mutex).super___shared_timed_mutex_base._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->_mutex).super___shared_timed_mutex_base._M_rwlock + 0x18) = 0;
  (this->_mutex).super___shared_timed_mutex_base._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->_mutex).super___shared_timed_mutex_base._M_rwlock + 8) = 0;
  (this->_recordersByInstance)._M_h._M_buckets = &(this->_recordersByInstance)._M_h._M_single_bucket
  ;
  (this->_recordersByInstance)._M_h._M_bucket_count = 1;
  (this->_recordersByInstance)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_recordersByInstance)._M_h._M_element_count = 0;
  (this->_recordersByInstance)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_recordersByInstance)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_recordersByInstance)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->data_).session_labels_._M_h._M_buckets =
       &(this->data_).session_labels_._M_h._M_single_bucket;
  (this->data_).session_labels_._M_h._M_bucket_count = 1;
  (this->data_).session_labels_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->data_).session_labels_._M_h._M_element_count = 0;
  (this->data_).session_labels_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->data_).session_labels_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->data_).session_labels_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->data_).object_info_.object_info_.
  super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_).object_info_.object_info_.
  super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data_).object_info_.object_info_.
  super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s = getenv("XR_LOADER_DEBUG");
  local_48 = &local_38;
  if (__s == (char *)0x0) {
    local_40 = 0;
    local_38 = 0;
  }
  else {
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,__s,__s + sVar2);
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_48);
  if (iVar1 != 0) {
    MakeStdErrLoaderLogRecorder(&local_50);
    AddLogRecorder(this,(unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)
                        &local_50);
    if (local_50._M_head_impl != (LoaderLogRecorder *)0x0) {
      (*(local_50._M_head_impl)->_vptr_LoaderLogRecorder[1])();
    }
  }
  if (local_40 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)&local_48);
    if ((((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)&local_48), iVar1 != 0)) &&
        (iVar1 = std::__cxx11::string::compare((char *)&local_48), iVar1 != 0)) &&
       (iVar1 = std::__cxx11::string::compare((char *)&local_48), iVar1 != 0)) {
      std::__cxx11::string::compare((char *)&local_48);
    }
    MakeStdOutLoaderLogRecorder(&local_50,0);
    AddLogRecorder(this,(unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *)
                        &local_50);
    if (local_50._M_head_impl != (LoaderLogRecorder *)0x0) {
      (*(local_50._M_head_impl)->_vptr_LoaderLogRecorder[1])();
    }
  }
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  return;
}

Assistant:

LoaderLogger::LoaderLogger() {
    std::string debug_string = PlatformUtilsGetEnv("XR_LOADER_DEBUG");

    // Add an error logger by default so that we at least get errors out to std::cerr.
    // Normally we enable stderr output. But if the XR_LOADER_DEBUG environment variable is
    // present as "none" then we don't.
    if (debug_string != "none") {
        AddLogRecorder(MakeStdErrLoaderLogRecorder(nullptr));
#ifdef __ANDROID__
        // Add a logcat logger by default.
        AddLogRecorder(MakeLogcatLoaderLogRecorder());
#endif  // __ANDROID__
    }

#ifdef _WIN32
    // Add an debugger logger by default so that we at least get errors out to the debugger.
    AddLogRecorder(MakeDebuggerLoaderLogRecorder(nullptr));
#endif

    // If the environment variable to enable loader debugging is set, then enable the
    // appropriate logging out to std::cout.
    if (!debug_string.empty()) {
        XrLoaderLogMessageSeverityFlags debug_flags = {};
        if (debug_string == "error") {
            debug_flags = XR_LOADER_LOG_MESSAGE_SEVERITY_ERROR_BIT;
        } else if (debug_string == "warn") {
            debug_flags = XR_LOADER_LOG_MESSAGE_SEVERITY_ERROR_BIT | XR_LOADER_LOG_MESSAGE_SEVERITY_WARNING_BIT;
        } else if (debug_string == "info") {
            debug_flags = XR_LOADER_LOG_MESSAGE_SEVERITY_ERROR_BIT | XR_LOADER_LOG_MESSAGE_SEVERITY_WARNING_BIT |
                          XR_LOADER_LOG_MESSAGE_SEVERITY_INFO_BIT;
        } else if (debug_string == "all" || debug_string == "verbose") {
            debug_flags = XR_LOADER_LOG_MESSAGE_SEVERITY_ERROR_BIT | XR_LOADER_LOG_MESSAGE_SEVERITY_WARNING_BIT |
                          XR_LOADER_LOG_MESSAGE_SEVERITY_INFO_BIT | XR_LOADER_LOG_MESSAGE_SEVERITY_VERBOSE_BIT;
        }
        AddLogRecorder(MakeStdOutLoaderLogRecorder(nullptr, debug_flags));
    }
}